

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O1

void PANIC(char *functionname,char *filename,unsigned_long_long linenum)

{
  fprintf(_stderr,"%s%s%s%s in %s%s%s at line %s%s%lld %s%sfailed.%s\n","\x1b[1m","\x1b[95m",
          functionname,"\x1b[91m","\x1b[93m",filename,"\x1b[91m","\x1b[0m","\x1b[34m",linenum,
          "\x1b[91m","\x1b[1m","\x1b[0m");
  exit(-1);
}

Assistant:

__attribute__((__noreturn__))
#endif /* _WIN32 */
void
PANIC(const char *functionname,
      const char *filename,
      const unsigned long long linenum)
{
  do
  {
    fprintf(stderr,
            "%s%s%s%s in %s%s%s at line %s%s%lld %s%sfailed.%s\n",
            colors.styles.bold,
            colors.strong_fg.magenta,
            functionname,
            colors.strong_fg.red,
            colors.strong_fg.yellow,
            filename,
            colors.strong_fg.red,
            colors.styles.reset,
            colors.normal_fg.blue,
            linenum,
            colors.strong_fg.red,
            colors.styles.bold,
            colors.styles.reset);
    exit(-1);
  } while (1); /* Keep the compiler happy. */
}